

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O1

int ixmlElement_setTagName(IXML_Element *element,char *tagName)

{
  int iVar1;
  char *pcVar2;
  
  if ((element != (IXML_Element *)0x0) && (tagName != (char *)0x0)) {
    if (element->tagName != (char *)0x0) {
      free(element->tagName);
    }
    pcVar2 = strdup(tagName);
    element->tagName = pcVar2;
    iVar1 = 0x66;
    if (pcVar2 != (char *)0x0) {
      iVar1 = 0;
    }
    return iVar1;
  }
  __assert_fail("element != NULL && tagName != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/element.c"
                ,0x41,"int ixmlElement_setTagName(IXML_Element *, const char *)");
}

Assistant:

int ixmlElement_setTagName(IXML_Element *element, const char *tagName)
{
	int rc = IXML_SUCCESS;

	assert(element != NULL && tagName != NULL);

	if (element == NULL || tagName == NULL) {
		return IXML_FAILED;
	}

	if (element->tagName != NULL) {
		free(element->tagName);
	}
	element->tagName = strdup(tagName);
	if (element->tagName == NULL) {
		rc = IXML_INSUFFICIENT_MEMORY;
	}

	return rc;
}